

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

Closure * luaY_parser(lua_State *L,ZIO *z,Mbuffer *buff,Dyndata *dyd,char *name,int firstchar)

{
  StkId pTVar1;
  GCObject *pGVar2;
  global_State *pgVar3;
  TString *source;
  BlockCnt bl;
  expdesc local_100;
  FuncState funcstate;
  LexState lexstate;
  
  pGVar2 = (GCObject *)luaF_newLclosure(L,1);
  pTVar1 = L->top;
  (pTVar1->value_).gc = pGVar2;
  pTVar1->tt_ = 0x46;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if ((long)L->stack_last - (long)(pTVar1 + 1) < 0x10) {
    luaD_growstack(L,0);
  }
  pgVar3 = (global_State *)luaF_newproto(L);
  (pGVar2->th).l_G = pgVar3;
  funcstate.f = (Proto *)pgVar3;
  source = luaS_new(L,name);
  *(TString **)&(pgVar3->l_registry).tt_ = source;
  (dyd->label).n = 0;
  (dyd->gt).n = 0;
  (dyd->actvar).n = 0;
  lexstate.buff = buff;
  lexstate.dyd = dyd;
  luaX_setinput(L,&lexstate,z,source,firstchar);
  open_func(&lexstate,&funcstate,&bl);
  (funcstate.f)->is_vararg = '\x01';
  local_100.t = -1;
  local_100.f = -1;
  local_100.k = VLOCAL;
  local_100.u.info = 0;
  newupvalue(&funcstate,lexstate.envn,&local_100);
  luaX_next(&lexstate);
  statlist(&lexstate);
  check(&lexstate,0x11e);
  close_func(&lexstate);
  return (Closure *)pGVar2;
}

Assistant:

Closure *luaY_parser (lua_State *L, ZIO *z, Mbuffer *buff,
                      Dyndata *dyd, const char *name, int firstchar) {
  LexState lexstate;
  FuncState funcstate;
  Closure *cl = luaF_newLclosure(L, 1);  /* create main closure */
  /* anchor closure (to avoid being collected) */
  setclLvalue(L, L->top, cl);
  incr_top(L);
  funcstate.f = cl->l.p = luaF_newproto(L);
  funcstate.f->source = luaS_new(L, name);  /* create and anchor TString */
  lexstate.buff = buff;
  lexstate.dyd = dyd;
  dyd->actvar.n = dyd->gt.n = dyd->label.n = 0;
  luaX_setinput(L, &lexstate, z, funcstate.f->source, firstchar);
  mainfunc(&lexstate, &funcstate);
  lua_assert(!funcstate.prev && funcstate.nups == 1 && !lexstate.fs);
  /* all scopes should be correctly finished */
  lua_assert(dyd->actvar.n == 0 && dyd->gt.n == 0 && dyd->label.n == 0);
  return cl;  /* it's on the stack too */
}